

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QIconEngine *engine)

{
  _func_int **pp_Var1;
  char cVar2;
  QDebug *pQVar3;
  long *in_RDX;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QArrayDataPointer<char16_t> local_50;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_38,(QDebug *)engine);
  pp_Var1 = engine->_vptr_QIconEngine;
  *(undefined1 *)(pp_Var1 + 6) = 0;
  if (in_RDX == (long *)0x0) {
    t = "QIconEngine(nullptr)";
  }
  else {
    *(undefined1 *)((long)pp_Var1 + 0x31) = 1;
    (**(code **)(*in_RDX + 0x38))(&local_50);
    pQVar3 = QDebug::operator<<((QDebug *)engine,(QString *)&local_50);
    QDebug::operator<<(pQVar3,"(");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QDebug::operator<<((QDebug *)engine,in_RDX);
    cVar2 = (**(code **)(*in_RDX + 0x68))();
    if (cVar2 == '\0') {
      *(undefined1 *)((long)engine->_vptr_QIconEngine + 0x31) = 0;
      pQVar3 = QDebug::operator<<((QDebug *)engine,", ");
      (**(code **)(*in_RDX + 0x60))(&local_50);
      QDebug::operator<<(pQVar3,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
    else {
      QDebug::operator<<((QDebug *)engine,", null");
    }
    t = ")";
  }
  QDebug::operator<<((QDebug *)engine,t);
  pp_Var1 = engine->_vptr_QIconEngine;
  engine->_vptr_QIconEngine = (_func_int **)0x0;
  *(_func_int ***)debug.stream = pp_Var1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QIconEngine *engine)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (engine) {
        debug.noquote() << engine->key() << "(";
        debug << static_cast<const void *>(engine);
        if (!engine->isNull())
            debug.quote() << ", " << engine->iconName();
        else
            debug << ", null";
        debug << ")";
    } else {
        debug << "QIconEngine(nullptr)";
    }
    return debug;
}